

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Rect::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Rect *this)

{
  uint32_t uVar1;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  SingleMthdTest *pSVar2;
  result_type rVar3;
  MthdNotify *this_00;
  MthdPatch *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdCtxClip *this_04;
  MthdCtxPattern *this_05;
  MthdCtxRop *this_06;
  MthdCtxBeta *this_07;
  MthdVeryMissing *this_08;
  MthdOperation *this_09;
  MthdSolidFormat *this_10;
  MthdSolidColor *this_11;
  MthdVtxXy *this_12;
  MthdRect *this_13;
  MthdCtxSurf *this_14;
  MthdCtxSurf2D *this_15;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [32];
  SingleMthdTest *local_398;
  MthdCtxSurf2D *local_390;
  iterator local_388;
  undefined8 local_380;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_378;
  const_iterator local_370;
  SingleMthdTest **local_368;
  undefined1 local_35a;
  allocator local_359;
  string local_358 [32];
  MthdCtxSurf *local_338;
  MthdCtxSurf **local_330;
  undefined8 local_328;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_320;
  const_iterator local_318;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_30b;
  undefined1 local_30a;
  allocator local_309;
  string local_308 [38];
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [38];
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  allocator local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [38];
  undefined1 local_242;
  allocator local_241;
  string local_240 [38];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [38];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [38];
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [38];
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [38];
  undefined1 local_17a;
  allocator local_179;
  string local_178 [38];
  undefined1 local_152;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [38];
  undefined1 local_102;
  allocator local_101;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [48];
  SingleMthdTest *local_a8;
  MthdNotify *local_a0;
  MthdPatch *local_98;
  MthdPmTrigger *local_90;
  MthdDmaNotify *local_88;
  MthdCtxClip *local_80;
  MthdCtxPattern *local_78;
  MthdCtxRop *local_70;
  MthdCtxBeta *local_68;
  MthdVeryMissing *local_60;
  MthdOperation *local_58;
  MthdSolidFormat *local_50;
  MthdSolidColor *local_48;
  MthdVtxXy *local_40;
  MthdRect *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Rect *local_18;
  Rect *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Rect *)__return_storage_ptr__;
  pSVar2 = (SingleMthdTest *)operator_new(0x25950);
  local_da = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"nop",&local_d9);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_d8,-1,
             (this->super_Class).cls,0x100,1,4);
  local_da = 0;
  local_a8 = pSVar2;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_102 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"notify",&local_101);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_100,0,
             (this->super_Class).cls,0x104,1,4);
  local_102 = 0;
  local_a0 = this_00;
  this_01 = (MthdPatch *)operator_new(0x25950);
  local_12a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"patch",&local_129);
  MthdPatch::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_128,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_12a = 0;
  local_98 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_152 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"pm_trigger",&local_151);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_150,-1,
             (this->super_Class).cls,0x140,1,4);
  local_152 = 0;
  local_90 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_17a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"dma_notify",&local_179);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_178,1,
             (this->super_Class).cls,0x180,1,4);
  local_17a = 0;
  local_88 = this_03;
  this_04 = (MthdCtxClip *)operator_new(0x25950);
  local_1a2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"ctx_clip",&local_1a1);
  MthdCtxClip::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1a0,2,
             (this->super_Class).cls,0x184,1,4);
  local_1a2 = 0;
  local_80 = this_04;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_1ca = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"ctx_pattern",&local_1c9);
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (this_05,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1c8,3,uVar1,0x188,
             uVar1 != 0x1e);
  local_1ca = 0;
  local_78 = this_05;
  this_06 = (MthdCtxRop *)operator_new(0x25950);
  local_1f2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"ctx_rop",&local_1f1);
  MthdCtxRop::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1f0,4,
             (this->super_Class).cls,0x18c,1,4);
  local_1f2 = 0;
  local_70 = this_06;
  this_07 = (MthdCtxBeta *)operator_new(0x25950);
  local_21a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"ctx_beta",&local_219);
  MthdCtxBeta::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_218,5,
             (this->super_Class).cls,400,1,4);
  local_21a = 0;
  local_68 = this_07;
  this_08 = (MthdVeryMissing *)operator_new(0x25950);
  local_242 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"missing",&local_241);
  MthdVeryMissing::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_240,-1,
             (this->super_Class).cls,0x200,1,4);
  local_242 = 0;
  local_60 = this_08;
  this_09 = (MthdOperation *)operator_new(0x25958);
  local_26a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"operation",&local_269);
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (this_09,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_268,8,uVar1,0x2fc,
             uVar1 != 0x1e);
  local_26a = 0;
  local_58 = this_09;
  this_10 = (MthdSolidFormat *)operator_new(0x25958);
  local_292 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"format",&local_291);
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (this_10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_290,9,uVar1,0x300,
             uVar1 != 0x1e);
  local_292 = 0;
  local_50 = this_10;
  this_11 = (MthdSolidColor *)operator_new(0x25950);
  local_2ba = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"color",&local_2b9);
  MthdSolidColor::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2b8,10,
             (this->super_Class).cls,0x304,1,4);
  local_2ba = 0;
  local_48 = this_11;
  this_12 = (MthdVtxXy *)operator_new(0x25958);
  local_2e2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"rect.xy",&local_2e1);
  MthdVtxXy::MthdVtxXy
            (this_12,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2e0,0xb,
             (this->super_Class).cls,0x400,0x10,8,1);
  local_2e2 = 0;
  local_40 = this_12;
  this_13 = (MthdRect *)operator_new(0x25958);
  local_30a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"rect.rect",&local_309);
  MthdRect::MthdRect(this_13,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_308,0xc,
                     (this->super_Class).cls,0x404,0x10,8,4);
  local_30a = 0;
  local_30 = &local_a8;
  local_28 = 0xf;
  local_38 = this_13;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_30b);
  __l_01._M_len = local_28;
  __l_01._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_01,&local_30b);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_30b);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if ((this->super_Class).cls == 0x1e) {
    local_320._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_318,&local_320);
    this_14 = (MthdCtxSurf *)operator_new(0x25958);
    local_35a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"ctx_dst",&local_359);
    MthdCtxSurf::MthdCtxSurf
              (this_14,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_358,7,
               (this->super_Class).cls,0x194,0);
    local_35a = 0;
    local_330 = &local_338;
    local_328 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_330;
    local_338 = this_14;
    local_368 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_318,__l_00);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  else {
    local_378._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_370,&local_378);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_3ba = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"ctx_beta4",&local_3b9);
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3b8,6
               ,(this->super_Class).cls,0x194,1,4);
    local_3ba = 0;
    local_398 = pSVar2;
    this_15 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"ctx_surf2d",&local_3e1);
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_15,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3e0,7,
               (this->super_Class).cls,0x198,1);
    local_388 = &local_398;
    local_380 = 2;
    __l._M_len = 2;
    __l._M_array = local_388;
    local_390 = this_15;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_370,__l);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Rect::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1e),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdVeryMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1e),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1e),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "rect.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdRect(opt, rnd(), "rect.rect", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
	};
	if (cls == 0x1e) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}